

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

void mxx::scatter<int>(int *msgs,size_t size,int *out,int root,comm *comm)

{
  datatype dt;
  
  if (0x7ffffffe < (long)comm->m_size * size) {
    impl::scatter_big<int>(msgs,size,out,root,comm);
    return;
  }
  dt._vptr_datatype = (_func_int **)&PTR__datatype_00169300;
  dt.mpitype = (MPI_Datatype)&ompi_mpi_int;
  dt.builtin = true;
  MPI_Scatter();
  datatype::~datatype(&dt);
  return;
}

Assistant:

void scatter(const T* msgs, size_t size, T* out, int root, const mxx::comm& comm = mxx::comm())
{
    if (size*comm.size() >= mxx::max_int) {
        // own scatter for large messages
        impl::scatter_big(msgs, size, out, root, comm);
    } else {
        // regular implementation
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Scatter(const_cast<T*>(msgs), size, dt.type(),
                    out, size, dt.type(), root, comm);
    }
}